

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O3

int vscode_parse_int64arg_request
              (json_value *js,ProtocolMessage *msg,int msgtype,char *key,FILE *log)

{
  json_value *js_00;
  int64_t iVar1;
  int *found;
  undefined4 in_register_00000014;
  
  found = (int *)key;
  js_00 = get_object_value(js,"arguments",(FILE *)CONCAT44(in_register_00000014,msgtype));
  if (js_00 == (json_value *)0x0) {
    msgtype = -1;
  }
  else {
    iVar1 = get_int_value(js_00,key,(FILE *)&stack0xffffffffffffffe4,found);
    *(int64_t *)((long)&msg->u + 0x28) = iVar1;
    (msg->u).Event.event_type = msgtype;
  }
  return msgtype;
}

Assistant:

static int vscode_parse_int64arg_request(json_value *js, ProtocolMessage *msg,
                                       int msgtype, const char *key,
                                       FILE *log) {
  json_value *args = get_object_value(js, "arguments", log);
  if (args == NULL) return VSCODE_UNKNOWN_REQUEST;
  int found = 0;
  msg->u.Request.u.CommonInt64Request.integer64 =
  get_int_value(args, key, log, &found);
  msg->u.Request.request_type = msgtype;
  return msgtype;
}